

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O3

bool __thiscall
testing::internal::MaxBipartiteMatchState::TryAugment
          (MaxBipartiteMatchState *this,size_t ilhs,vector<char,_std::allocator<char>_> *seen)

{
  pointer pcVar1;
  bool bVar2;
  MatchMatrix *pMVar3;
  pointer puVar4;
  ulong uVar5;
  unsigned_long uVar6;
  
  pMVar3 = this->graph_;
  uVar5 = *(ulong *)(pMVar3 + 8);
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      pcVar1 = (seen->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((pcVar1[uVar6] == '\0') &&
         (*(char *)(uVar6 + uVar5 * ilhs + *(long *)(pMVar3 + 0x10)) == '\x01')) {
        pcVar1[uVar6] = '\x01';
        puVar4 = (this->right_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (puVar4[uVar6] == 0xffffffffffffffff) {
LAB_00113950:
          (this->left_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[ilhs] = uVar6;
          puVar4[uVar6] = ilhs;
          return true;
        }
        bVar2 = TryAugment(this,puVar4[uVar6],seen);
        if (bVar2) {
          puVar4 = (this->right_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          goto LAB_00113950;
        }
        pMVar3 = this->graph_;
      }
      uVar6 = uVar6 + 1;
      uVar5 = *(ulong *)(pMVar3 + 8);
    } while (uVar6 < uVar5);
  }
  return false;
}

Assistant:

bool TryAugment(size_t ilhs, ::std::vector<char>* seen) {
    for (size_t irhs = 0; irhs < graph_->RhsSize(); ++irhs) {
      if ((*seen)[irhs]) continue;
      if (!graph_->HasEdge(ilhs, irhs)) continue;
      // There's an available edge from ilhs to irhs.
      (*seen)[irhs] = 1;
      // Next a search is performed to determine whether
      // this edge is a dead end or leads to the sink.
      //
      // right_[irhs] == kUnused means that there is residual flow from
      // right node irhs to the sink, so we can use that to finish this
      // flow path and return success.
      //
      // Otherwise there is residual flow to some ilhs. We push flow
      // along that path and call ourselves recursively to see if this
      // ultimately leads to sink.
      if (right_[irhs] == kUnused || TryAugment(right_[irhs], seen)) {
        // Add flow from left_[ilhs] to right_[irhs].
        left_[ilhs] = irhs;
        right_[irhs] = ilhs;
        return true;
      }
    }
    return false;
  }